

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O1

QRectF * __thiscall
QGraphicsItemEffectSourcePrivate::boundingRect
          (QRectF *__return_storage_ptr__,QGraphicsItemEffectSourcePrivate *this,
          CoordinateSystem system)

{
  long in_FS_OFFSET;
  QRectF local_70;
  QRectF local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if ((system == DeviceCoordinates) && (this->info == (QGraphicsItemPaintInfo *)0x0)) {
    boundingRect();
  }
  else {
    *(undefined4 *)&__return_storage_ptr__->w = 0xffffffff;
    *(undefined4 *)((long)&__return_storage_ptr__->w + 4) = 0xffffffff;
    *(undefined4 *)&__return_storage_ptr__->h = 0xffffffff;
    *(undefined4 *)((long)&__return_storage_ptr__->h + 4) = 0xffffffff;
    *(undefined4 *)&__return_storage_ptr__->xp = 0xffffffff;
    *(undefined4 *)((long)&__return_storage_ptr__->xp + 4) = 0xffffffff;
    *(undefined4 *)&__return_storage_ptr__->yp = 0xffffffff;
    *(undefined4 *)((long)&__return_storage_ptr__->yp + 4) = 0xffffffff;
    (*this->item->_vptr_QGraphicsItem[3])(__return_storage_ptr__);
    if ((((this->item->d_ptr).d)->children).d.size != 0) {
      QGraphicsItem::childrenBoundingRect(&local_70,this->item);
      QRectF::operator|(&local_50,__return_storage_ptr__);
      __return_storage_ptr__->w = local_50.w;
      __return_storage_ptr__->h = local_50.h;
      __return_storage_ptr__->xp = local_50.xp;
      __return_storage_ptr__->yp = local_50.yp;
    }
    if (system == DeviceCoordinates) {
      QPainter::worldTransform();
      QTransform::mapRect(&local_50);
      __return_storage_ptr__->w = local_50.w;
      __return_storage_ptr__->h = local_50.h;
      __return_storage_ptr__->xp = local_50.xp;
      __return_storage_ptr__->yp = local_50.yp;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QRectF QGraphicsItemEffectSourcePrivate::boundingRect(Qt::CoordinateSystem system) const
{
    const bool deviceCoordinates = (system == Qt::DeviceCoordinates);
    if (!info && deviceCoordinates) {
        // Device coordinates without info not yet supported.
        qWarning("QGraphicsEffectSource::boundingRect: Not yet implemented, lacking device context");
        return QRectF();
    }

    QRectF rect = item->boundingRect();
    if (!item->d_ptr->children.isEmpty())
        rect |= item->childrenBoundingRect();

    if (deviceCoordinates) {
        Q_ASSERT(info->painter);
        rect = info->painter->worldTransform().mapRect(rect);
    }

    return rect;
}